

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

void VW::finish(vw *all,bool delete_all)

{
  vw_ostream *pvVar1;
  double dVar2;
  options_i *poVar3;
  _func_int *p_Var4;
  shared_data *psVar5;
  pointer pcVar6;
  parser *ppVar7;
  substring *__ptr;
  namedlabels *this;
  feature_dict *pfVar8;
  features *this_00;
  char cVar9;
  float fVar10;
  bool bVar11;
  int iVar12;
  ostream *poVar13;
  vw_ostream *pvVar14;
  pointer pdVar15;
  vw_exception *this_01;
  bool *pbVar16;
  long lVar17;
  undefined7 in_register_00000031;
  int *__ptr_00;
  char *pcVar18;
  byte bVar19;
  ulong uVar20;
  float best_constant_loss;
  vw_exception finalize_regressor_exception;
  float local_d4 [2];
  undefined4 local_cc;
  string local_c8;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  float local_68 [14];
  
  local_cc = (undefined4)CONCAT71(in_register_00000031,delete_all);
  if (all->quiet == false) {
    poVar3 = all->options;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"audit_regressor","");
    iVar12 = (*poVar3->_vptr_options_i[1])(poVar3,local_88);
    bVar19 = (byte)iVar12 ^ 1;
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
  }
  else {
    bVar19 = 0;
  }
  if (bVar19 == 0) goto LAB_0012c587;
  pvVar1 = &all->trace_message;
  *(undefined8 *)
   ((all->trace_message).super_ostream._vptr_basic_ostream[-3] + 8 +
   (long)&(all->trace_message).super_ostream._vptr_basic_ostream) = 6;
  p_Var4 = (all->trace_message).super_ostream._vptr_basic_ostream[-3];
  *(uint *)(p_Var4 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) =
       *(uint *)(p_Var4 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) &
       0xfffffefb | 4;
  cVar9 = (char)pvVar1;
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
  std::ostream::put(cVar9);
  poVar13 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"finished run",0xc);
  uVar20 = all->current_pass;
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
  std::ostream::put(cVar9);
  poVar13 = (ostream *)std::ostream::flush();
  if (uVar20 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"number of examples = ",0x15);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"number of examples per pass = ",0x1e);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
    std::ostream::put(cVar9);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"passes used = ",0xe);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
  std::ostream::put(cVar9);
  poVar13 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"weighted example sum = ",0x17);
  std::ostream::_M_insert<double>
            (all->sd->weighted_labeled_examples + all->sd->weighted_unlabeled_examples);
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
  std::ostream::put(cVar9);
  poVar13 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"weighted label sum = ",0x15);
  std::ostream::_M_insert<double>(all->sd->weighted_labels);
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
  std::ostream::put(cVar9);
  poVar13 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"average loss = ",0xf);
  psVar5 = all->sd;
  pvVar14 = pvVar1;
  if (all->holdout_set_off == true) {
    if (psVar5->weighted_labeled_examples <= 0.0) {
      pcVar18 = "n.a.";
      lVar17 = 4;
      goto LAB_0012c343;
    }
    std::ostream::_M_insert<double>(psVar5->sum_loss / psVar5->weighted_labeled_examples);
  }
  else {
    dVar2 = psVar5->holdout_best_loss;
    if (((dVar2 == 3.4028234663852886e+38) && (!NAN(dVar2))) ||
       ((dVar2 == 1.7014117331926443e+38 && (!NAN(dVar2))))) {
      pcVar18 = "undefined (no holdout)";
      lVar17 = 0x16;
    }
    else {
      pvVar14 = (vw_ostream *)std::ostream::_M_insert<double>(dVar2);
      pcVar18 = " h";
      lVar17 = 2;
    }
LAB_0012c343:
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar14->super_ostream,pcVar18,lVar17);
  }
  if (all->sd->report_multiclass_log_loss == true) {
    bVar11 = all->holdout_set_off;
    std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
    std::ostream::put(cVar9);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"average multiclass log loss = ",0x1e);
    psVar5 = all->sd;
    if (bVar11 == true) {
      std::ostream::_M_insert<double>
                (psVar5->multiclass_log_loss / psVar5->weighted_labeled_examples);
    }
    else {
      poVar13 = std::ostream::_M_insert<double>
                          (psVar5->holdout_multiclass_log_loss / psVar5->weighted_labeled_examples);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," h",2);
    }
  }
  bVar11 = get_best_constant(all,local_68,local_d4);
  if (bVar11) {
    std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + cVar9);
    std::ostream::put(cVar9);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"best constant = ",0x10);
    std::ostream::_M_insert<double>((double)local_68[0]);
    if ((local_d4[0] != 1.1754944e-38) || (NAN(local_d4[0]))) {
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + cVar9);
      std::ostream::put(cVar9);
      poVar13 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"best constant\'s loss = ",0x17);
      std::ostream::_M_insert<double>((double)local_d4[0]);
    }
  }
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
  std::ostream::put(cVar9);
  poVar13 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"total feature number = ",0x17);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  if (all->sd->queries != 0) {
    std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
    std::ostream::put(cVar9);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"total queries = ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  }
  std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + cVar9);
  std::ostream::put(cVar9);
  std::ostream::flush();
LAB_0012c587:
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"empty","");
  vw_exception::vw_exception
            ((vw_exception *)local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x715,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pcVar6 = (all->final_regressor_name)._M_dataplus._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar6,pcVar6 + (all->final_regressor_name)._M_string_length);
  finalize_regressor(all,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (all->l != (learner<char,_char> *)0x0) {
    LEARNER::learner<char,_char>::finish(all->l);
    if (all->l != (base_learner *)0x0) {
      free(all->l);
    }
  }
  if ((all->should_delete_options == true) && (all->options != (options_i *)0x0)) {
    (*all->options->_vptr_options_i[9])();
  }
  free_parser(all);
  finalize_source(all->p);
  v_array<substring>::clear(&all->p->parse_name);
  ppVar7 = all->p;
  __ptr = (ppVar7->parse_name)._begin;
  if (__ptr != (substring *)0x0) {
    free(__ptr);
  }
  (ppVar7->parse_name)._begin = (substring *)0x0;
  (ppVar7->parse_name)._end = (substring *)0x0;
  (ppVar7->parse_name).end_array = (substring *)0x0;
  ppVar7 = all->p;
  if (ppVar7 != (parser *)0x0) {
    parser::~parser(ppVar7);
    operator_delete(ppVar7);
  }
  pbVar16 = &(all->weights).dense_weights._seeded;
  if ((all->weights).sparse != false) {
    pbVar16 = &(all->weights).sparse_weights._seeded;
  }
  if (*pbVar16 == false) {
    this = all->sd->ldict;
    if (this != (namedlabels *)0x0) {
      namedlabels::~namedlabels(this);
      free(all->sd->ldict);
    }
    free(all->sd);
  }
  __ptr_00 = (all->final_prediction_sink)._begin;
  if ((all->final_prediction_sink)._end != __ptr_00) {
    uVar20 = 0;
    do {
      if (__ptr_00[uVar20] != 1) {
        io_buf::close_file_or_socket(__ptr_00[uVar20]);
      }
      uVar20 = uVar20 + 1;
      __ptr_00 = (all->final_prediction_sink)._begin;
    } while (uVar20 < (ulong)((long)(all->final_prediction_sink)._end - (long)__ptr_00 >> 2));
  }
  local_d4[1] = 0.0;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  (all->final_prediction_sink)._begin = (int *)0x0;
  (all->final_prediction_sink)._end = (int *)0x0;
  (all->final_prediction_sink).end_array = (int *)0x0;
  pdVar15 = (all->loaded_dictionaries).
            super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((all->loaded_dictionaries).
      super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar15) {
    uVar20 = 0;
    do {
      if (pdVar15[uVar20].name != (char *)0x0) {
        free(pdVar15[uVar20].name);
      }
      pfVar8 = (all->loaded_dictionaries).
               super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20].dict;
      for (pcVar18 = *(char **)(pfVar8 + 0x18); pcVar18 != *(char **)(pfVar8 + 0x28);
          pcVar18 = pcVar18 + 0x28) {
        if (*pcVar18 == '\x01') {
          this_00 = *(features **)(pcVar18 + 0x18);
          free(*(void **)(pcVar18 + 8));
          features::delete_v(this_00);
          operator_delete(this_00);
        }
      }
      pfVar8 = (all->loaded_dictionaries).
               super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20].dict;
      if (*(void **)(pfVar8 + 0x18) != (void *)0x0) {
        free(*(void **)(pfVar8 + 0x18));
      }
      *(undefined8 *)(pfVar8 + 0x18) = 0;
      *(undefined8 *)(pfVar8 + 0x20) = 0;
      *(undefined8 *)(pfVar8 + 0x28) = 0;
      pfVar8 = (all->loaded_dictionaries).
               super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20].dict;
      if (pfVar8 != (feature_dict *)0x0) {
        free(pfVar8);
      }
      uVar20 = uVar20 + 1;
      pdVar15 = (all->loaded_dictionaries).
                super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)(((long)(all->loaded_dictionaries).
                                     super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar15 >> 3
                              ) * -0x5555555555555555));
  }
  if (all->loss != (loss_function *)0x0) {
    (*all->loss->_vptr_loss_function[9])();
  }
  fVar10 = local_d4[1];
  if (all->all_reduce != (AllReduce *)0x0) {
    (*all->all_reduce->_vptr_AllReduce[1])();
  }
  if ((char)local_cc != '\0') {
    vw::~vw(all);
    operator_delete(all);
  }
  if (SUB41(fVar10,0) == '\0') {
    vw_exception::~vw_exception((vw_exception *)local_68);
    return;
  }
  this_01 = (vw_exception *)__cxa_allocate_exception(0x38);
  vw_exception::vw_exception(this_01,(vw_exception *)local_68);
  __cxa_throw(this_01,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void finish(vw& all, bool delete_all)
{
  // also update VowpalWabbit::PerformanceStatistics::get() (vowpalwabbit.cpp)
  if (!all.quiet && !all.options->was_supplied("audit_regressor"))
  {
    all.trace_message.precision(6);
    all.trace_message << std::fixed;
    all.trace_message << endl << "finished run";
    if (all.current_pass == 0 || all.current_pass == 1)
      all.trace_message << endl << "number of examples = " << all.sd->example_number;
    else
    {
      all.trace_message << endl << "number of examples per pass = " << all.sd->example_number / all.current_pass;
      all.trace_message << endl << "passes used = " << all.current_pass;
    }
    all.trace_message << endl << "weighted example sum = " << all.sd->weighted_examples();
    all.trace_message << endl << "weighted label sum = " << all.sd->weighted_labels;
    all.trace_message << endl << "average loss = ";
    if (all.holdout_set_off)
      if (all.sd->weighted_labeled_examples > 0)
        all.trace_message << all.sd->sum_loss / all.sd->weighted_labeled_examples;
      else
        all.trace_message << "n.a.";
    else if ((all.sd->holdout_best_loss == FLT_MAX) || (all.sd->holdout_best_loss == FLT_MAX * 0.5))
      all.trace_message << "undefined (no holdout)";
    else
      all.trace_message << all.sd->holdout_best_loss << " h";
    if (all.sd->report_multiclass_log_loss)
    {
      if (all.holdout_set_off)
        all.trace_message << endl
                          << "average multiclass log loss = "
                          << all.sd->multiclass_log_loss / all.sd->weighted_labeled_examples;
      else
        all.trace_message << endl
                          << "average multiclass log loss = "
                          << all.sd->holdout_multiclass_log_loss / all.sd->weighted_labeled_examples << " h";
    }

    float best_constant;
    float best_constant_loss;
    if (get_best_constant(all, best_constant, best_constant_loss))
    {
      all.trace_message << endl << "best constant = " << best_constant;
      if (best_constant_loss != FLT_MIN)
        all.trace_message << endl << "best constant's loss = " << best_constant_loss;
    }

    all.trace_message << endl << "total feature number = " << all.sd->total_features;
    if (all.sd->queries > 0)
      all.trace_message << endl << "total queries = " << all.sd->queries;
    all.trace_message << endl;
  }

  // implement finally.
  // finalize_regressor can throw if it can't write the file.
  // we still want to free up all the memory.
  vw_exception finalize_regressor_exception(__FILE__, __LINE__, "empty");
  bool finalize_regressor_exception_thrown = false;
  try
  {
    finalize_regressor(all, all.final_regressor_name);
  }
  catch (vw_exception& e)
  {
    finalize_regressor_exception = e;
    finalize_regressor_exception_thrown = true;
  }

  if (all.l != nullptr)
  {
    all.l->finish();
    free_it(all.l);
  }

  // Check if options object lifetime is managed internally.
  if (all.should_delete_options)
    delete all.options;

  // TODO: migrate all finalization into parser destructor
  free_parser(all);
  finalize_source(all.p);
  all.p->parse_name.clear();
  all.p->parse_name.delete_v();
  delete all.p;
  bool seeded;
  if (all.weights.seeded() > 0)
    seeded = true;
  else
    seeded = false;
  if (!seeded)
  {
    if (all.sd->ldict)
    {
      all.sd->ldict->~namedlabels();
      free(all.sd->ldict);
    }
    free(all.sd);
  }
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
    if (all.final_prediction_sink[i] != 1)
      io_buf::close_file_or_socket(all.final_prediction_sink[i]);
  all.final_prediction_sink.delete_v();
  for (size_t i = 0; i < all.loaded_dictionaries.size(); i++)
  {
    // Warning C6001 is triggered by the following:
    // (a) dictionary_info.name is allocated using 'calloc_or_throw<char>(strlen(s)+1)' and (b) freed using
    // 'free(all.loaded_dictionaries[i].name)'
    //
    // When the call to allocation is replaced by (a) 'new char[strlen(s)+1]' and deallocated using (b) 'delete []', the
    // warning goes away. Disable SDL warning.
    //    #pragma warning(disable:6001)
    free_it(all.loaded_dictionaries[i].name);
    //#pragma warning(default:6001)

    all.loaded_dictionaries[i].dict->iter(delete_dictionary_entry);
    all.loaded_dictionaries[i].dict->delete_v();
    free_it(all.loaded_dictionaries[i].dict);
  }
  delete all.loss;

  delete all.all_reduce;

  if (delete_all)
    delete &all;

  if (finalize_regressor_exception_thrown)
    throw finalize_regressor_exception;
}